

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itread.c
# Opt level: O2

int decompress16(DUMBFILE *f,short *data,int len,int it215,int stereo)

{
  uint uVar1;
  short sVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int extraout_EAX;
  ulong uVar8;
  ulong extraout_RAX;
  uint uVar9;
  short *psVar10;
  int iVar11;
  uint uVar12;
  byte bVar13;
  uint bitwidth;
  readblock_crap local_58;
  
  local_58.sourceend = (uchar *)0x0;
  local_58.rembits = 0;
  local_58._28_4_ = 0;
  local_58.sourcepos = (uchar *)0x0;
  psVar10 = data;
  iVar3 = 0;
  if (0 < len) {
    iVar3 = len;
  }
  while (iVar3 != 0) {
    *psVar10 = 0;
    psVar10 = psVar10 + (stereo + 1);
    iVar3 = iVar3 + -1;
  }
  uVar8 = (ulong)(uint)stereo;
  do {
    local_58.sourcebuf = (uchar *)0x0;
    iVar3 = (int)uVar8;
    if ((len < 1) || (iVar3 = readblock(f,&local_58), iVar3 != 0)) {
      return iVar3;
    }
    uVar4 = 0x4000;
    if ((uint)len < 0x4000) {
      uVar4 = len;
    }
    len = len - uVar4;
    uVar12 = 0x11;
    iVar11 = 0;
    iVar3 = 0;
    for (uVar5 = 0; uVar1 = uVar12, uVar5 != uVar4; uVar5 = uVar5 + 1) {
      do {
        while( true ) {
          while( true ) {
            uVar12 = uVar1;
            bitwidth = uVar12 & 0xff;
            uVar6 = readbits(bitwidth,&local_58);
            bVar13 = (byte)uVar12;
            if (6 < bVar13) break;
            if (uVar6 != 1 << (bVar13 - 1 & 0x1f)) goto LAB_0064b6a2;
            iVar7 = readbits(4,&local_58);
            uVar1 = (uint)(byte)((char)iVar7 + 2);
            if ((int)(iVar7 + 1U) < (int)bitwidth) {
              uVar1 = iVar7 + 1U;
            }
          }
          if (bVar13 < 0x11) break;
          if (bVar13 != 0x11) {
            free(local_58.sourcebuf);
            return extraout_EAX;
          }
          if ((uVar6 >> 0x10 & 1) == 0) goto LAB_0064b6ac;
          uVar1 = uVar6 + 1;
        }
        uVar9 = (0xffffU >> (0x11 - bVar13 & 0x1f)) + 0xfff8 & 0xffff;
      } while ((uVar6 - uVar9 != 0 && (int)uVar9 <= (int)uVar6) &&
              (uVar1 = (uint)((int)bitwidth <= (int)(uVar6 - uVar9)) + (uVar6 - uVar9),
              (int)uVar6 <= (int)(uVar9 + 0x10)));
      if (bVar13 != 0x10) {
LAB_0064b6a2:
        uVar6 = (int)(short)(uVar6 << (0x10 - bVar13 & 0x1f)) >> (0x10 - bVar13 & 0x1f);
      }
LAB_0064b6ac:
      iVar11 = iVar11 + uVar6;
      iVar3 = iVar3 + iVar11;
      sVar2 = (short)iVar3;
      if (it215 == 0) {
        sVar2 = (short)iVar11;
      }
      *data = sVar2;
      data = data + (ulong)(uint)stereo + 1;
    }
    free(local_58.sourcebuf);
    uVar8 = extraout_RAX;
  } while( true );
}

Assistant:

static int decompress16(DUMBFILE *f, short *data, int len, int it215, int stereo)
{
	int blocklen, blockpos;
	byte bitwidth;
	int32 val;
	short d1, d2;
	readblock_crap crap;

	memset(&crap, 0, sizeof(crap));

	for ( blocklen = 0, blockpos = 0; blocklen < len; blocklen++, blockpos += 1 + stereo )
		data[ blockpos ] = 0;

	while (len > 0) {
		//Read a block of compressed data:
		if (readblock(f, &crap))
			return -1;
		//Set up a few variables
		blocklen = (len < 0x4000) ? len : 0x4000; // Max block length is 0x4000 bytes
		blockpos = 0;
		bitwidth = 17;
		d1 = d2 = 0;
		//Start the decompression:
		while (blockpos < blocklen) {
			val = readbits(bitwidth, &crap);
			//Check for bit width change:

			if (bitwidth < 7) { //Method 1:
				if (val == (1 << (bitwidth - 1))) {
					val = readbits(4, &crap) + 1;
					bitwidth = (byte)((val < bitwidth) ? val : val + 1);
					continue;
				}
			}
			else if (bitwidth < 17) { //Method 2
				word border = (0xFFFF >> (17 - bitwidth)) - 8;

				if (val > border && val <= (border + 16)) {
					val -= border;
					bitwidth = (byte)(val < bitwidth ? val : val + 1);
					continue;
				}
			}
			else if (bitwidth == 17) { //Method 3
				if (val & 0x10000) {
					bitwidth = (byte)((val + 1) & 0xFF);
					continue;
				}
			}
			else { //Illegal width, abort ?
				freeblock(&crap);
				return -1;
			}

			//Expand the value to signed byte:
			{
				short v; //The sample value:
				if (bitwidth < 16) {
					byte shift = 16 - bitwidth;
					v = (short)(val << shift);
					v >>= shift;
				}
				else
					v = (short)val;

				//And integrate the sample value
				//(It always has to end with integration doesn't it ? ;-)
				d1 += v;
				d2 += d1;
			}

			//Store !
			/* Version 2.15 was an unofficial version with hacked compression
			 * code. Yay, better compression :D
			 */
			*data++ = it215 ? d2 : d1;
			data += stereo;
			len--;
			blockpos++;
		}
		freeblock(&crap);
	}
	return 0;
}